

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GenerateAppleInfoPList
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *targetName,string *fname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  string_view name;
  string_view value;
  string inFile;
  cmNewLineStyle local_1cc;
  string inMod;
  ios_base local_158 [264];
  string local_50;
  
  paVar1 = &inMod.field_2;
  inMod._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&inMod,"MACOSX_BUNDLE_INFO_PLIST","");
  psVar4 = (string *)cmGeneratorTarget::GetProperty(target,&inMod);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inMod._M_dataplus._M_p != paVar1) {
    operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
  }
  if ((psVar4 == (string *)0x0) || (psVar4->_M_string_length == 0)) {
    inFile._M_dataplus._M_p = (pointer)&inFile.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inFile,"MacOSXBundleInfo.plist.in","");
  }
  else {
    if (psVar4 == (string *)0x0) {
      psVar4 = &cmValue::Empty_abi_cxx11_;
    }
    inFile._M_dataplus._M_p = (pointer)&inFile.field_2;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&inFile,pcVar2,pcVar2 + psVar4->_M_string_length);
  }
  bVar3 = cmsys::SystemTools::FileIsFullPath(&inFile);
  if (!bVar3) {
    name._M_str = inFile._M_dataplus._M_p;
    name._M_len = inFile._M_string_length;
    cmMakefile::GetModulesFile_abi_cxx11_(&inMod,this->Makefile,name);
    if (inMod._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&inFile);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = cmsys::SystemTools::FileExists(&inFile,true);
  if (bVar3) {
    this_00 = this->Makefile;
    cmMakefile::PushScope(this_00);
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_BUNDLE_EXECUTABLE_NAME","");
    value._M_str = (targetName->_M_dataplus)._M_p;
    value._M_len = targetName->_M_string_length;
    cmMakefile::AddDefinition(this_00,&inMod,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&inMod,"MACOSX_BUNDLE_INFO_STRING","")
    ;
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&inMod,"MACOSX_BUNDLE_ICON_FILE","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_BUNDLE_GUI_IDENTIFIER","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_BUNDLE_LONG_VERSION_STRING","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&inMod,"MACOSX_BUNDLE_BUNDLE_NAME","")
    ;
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_BUNDLE_SHORT_VERSION_STRING","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_BUNDLE_BUNDLE_VERSION","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&inMod,"MACOSX_BUNDLE_COPYRIGHT","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    cmNewLineStyle::cmNewLineStyle(&local_1cc);
    cmMakefile::ConfigureFile(this_00,&inFile,fname,false,false,false,0,local_1cc);
    cmMakefile::PopScope(this_00);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&inMod);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&inMod,"Target ",7);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&inMod,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Info.plist template \"",0x16);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,inFile._M_dataplus._M_p,inFile._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" could not be found.",0x15);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inMod);
    std::ios_base::~ios_base(local_158);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inFile._M_dataplus._M_p != &inFile.field_2) {
    operator_delete(inFile._M_dataplus._M_p,inFile.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateAppleInfoPList(cmGeneratorTarget* target,
                                              const std::string& targetName,
                                              const std::string& fname)
{
  // Find the Info.plist template.
  cmValue in = target->GetProperty("MACOSX_BUNDLE_INFO_PLIST");
  std::string inFile = cmNonempty(in) ? *in : "MacOSXBundleInfo.plist.in";
  if (!cmSystemTools::FileIsFullPath(inFile)) {
    std::string inMod = this->Makefile->GetModulesFile(inFile);
    if (!inMod.empty()) {
      inFile = inMod;
    }
  }
  if (!cmSystemTools::FileExists(inFile, true)) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \"" << inFile
      << "\" could not be found.";
    cmSystemTools::Error(e.str());
    return;
  }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  cmMakefile::ScopePushPop varScope(mf);
  mf->AddDefinition("MACOSX_BUNDLE_EXECUTABLE_NAME", targetName);
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_INFO_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_GUI_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_LONG_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_BUNDLE_NAME");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_BUNDLE_VERSION");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_COPYRIGHT");
  mf->ConfigureFile(inFile, fname, false, false, false);
}